

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomSubset>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,GeomSubset *subset
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  _Base_ptr __lhs;
  Property *this;
  uint uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *pTVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  value_type *value;
  ostream *poVar9;
  size_type sVar10;
  mapped_type *this_00;
  _Base_ptr p_Var11;
  Property *args;
  Collection *coll;
  Property *prop;
  TypedAttributeWithFallback<tinyusdz::GeomSubset::ElementType> *result;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_>
  *in_stack_fffffffffffffcc8;
  allocator local_32a;
  allocator local_329;
  Property *local_328;
  TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *local_320;
  ParseResult ret;
  ParseResult ret_1;
  string attr_type_name;
  string local_268;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  optional<tinyusdz::Token> pv;
  function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  string local_70 [32];
  string local_50 [32];
  
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &table._M_t._M_impl.super__Rb_tree_header._M_header;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  table._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       table._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = anon_unknown_0::ReconstructMaterialBindingProperties
                    (&table,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                             *)properties,&subset->super_MaterialBinding,err);
  if (bVar5) {
    coll = &subset->super_Collection;
    if (subset == (GeomSubset *)0x0) {
      coll = (Collection *)0x0;
    }
    args = (Property *)warn;
    prop = (Property *)err;
    bVar5 = anon_unknown_0::ReconstructCollectionProperties
                      (&table,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                               *)properties,coll,warn,err,options->strict_allowedToken_check);
    if (bVar5) {
      result = &subset->elementType;
      local_320 = (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                  err;
      for (p_Var11 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar5 = (_Rb_tree_header *)p_Var11 == &(properties->_M_t)._M_impl.super__Rb_tree_header,
          !bVar5; p_Var11 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11)) {
        __lhs = p_Var11 + 1;
        ::std::__cxx11::string::string(local_70,(string *)__lhs);
        this = (Property *)(p_Var11 + 2);
        ::std::__cxx11::string::string((string *)&local_268,"familyName",&local_32a);
        ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
        ret.err._M_string_length = 0;
        ret.err.field_2._M_local_buf[0] = '\0';
        iVar8 = ::std::__cxx11::string::compare(local_70);
        local_328 = this;
        if (iVar8 == 0) {
          Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)this);
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&pv,&attr_type_name);
          if (_Var7) {
            ::std::__cxx11::string::_M_dispose();
LAB_001bf062:
            p_Var2 = p_Var11[6]._M_parent;
            p_Var3 = p_Var11[6]._M_left;
            if (p_Var3 != p_Var2) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(subset->familyName)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var11[6]._M_parent);
            }
            iVar8 = *(int *)((long)&p_Var11[0x17]._M_parent + 4);
            if (iVar8 == 0) {
              args = (Property *)0x208;
LAB_001bf0e2:
              (&(subset->familyName)._metas.interpolation.has_value_)
              [(long)&(args->_attrib)._name._M_dataplus._M_p] = true;
LAB_001bf2c6:
              AttrMetas::operator=(&(subset->familyName)._metas,(AttrMetas *)(p_Var11 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_268);
              ret.code = Success;
            }
            else if (iVar8 == 1) {
              if (p_Var11[3]._M_color == _S_black) {
                if (p_Var11[5]._M_left == p_Var11[5]._M_parent) {
                  bVar6 = Attribute::is_blocked(&local_328->_attrib);
                  args = (Property *)0x250;
                  if (bVar6) goto LAB_001bf0e2;
                  bVar6 = primvar::PrimVar::has_value((PrimVar *)&p_Var11[4]._M_parent);
                  if (!bVar6) goto LAB_001bf2b5;
                  Attribute::get_value<tinyusdz::Token>
                            ((optional<tinyusdz::Token> *)&ret_1,&local_328->_attrib);
                  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
                            (&pv,(optional<tinyusdz::Token> *)&ret_1);
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional
                            ((optional<tinyusdz::Token> *)&ret_1);
                  bVar6 = pv.has_value_;
                  if (pv.has_value_ == true) {
                    value = nonstd::optional_lite::optional<tinyusdz::Token>::value(&pv);
                    nonstd::optional_lite::optional<tinyusdz::Token>::operator=
                              (&(subset->familyName)._attrib,value);
                  }
                  else {
                    ret.code = VariabilityMismatch;
                    ::std::__cxx11::string::assign((char *)&ret.err);
                  }
                  nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&pv);
                  if (bVar6 != false) goto LAB_001bf2c6;
                }
                else {
                  ret.code = VariabilityMismatch;
                  ::std::__cxx11::string::assign((char *)&ret.err);
                }
              }
              else {
                ret.code = VariabilityMismatch;
                ::std::__cxx11::string::string
                          ((string *)&ret_1,"Attribute `{}` must be `uniform` variability.",
                           &local_329);
                fmt::format<std::__cxx11::string>
                          ((string *)&pv,(fmt *)&ret_1,&local_268,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&pv);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
            }
            else {
LAB_001bf2b5:
              if (p_Var3 != p_Var2) goto LAB_001bf2c6;
              ret.code = InternalError;
              ::std::__cxx11::string::assign((char *)&ret.err);
            }
          }
          else {
            tinyusdz::value::TypeTraits<tinyusdz::Token>::underlying_type_name_abi_cxx11_();
            _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret_1,&attr_type_name);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (_Var7) goto LAB_001bf062;
            ret.code = TypeMismatch;
            ::std::__cxx11::stringstream::stringstream((stringstream *)&pv);
            poVar9 = ::std::operator<<((ostream *)((long)&pv.contained + 8),
                                       "Property type mismatch. ");
            poVar9 = ::std::operator<<(poVar9,(string *)&local_268);
            poVar9 = ::std::operator<<(poVar9," expects type `");
            tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
            poVar9 = ::std::operator<<(poVar9,(string *)&ret_1);
            poVar9 = ::std::operator<<(poVar9,"` but defined as type `");
            poVar9 = ::std::operator<<(poVar9,(string *)&attr_type_name);
            ::std::operator<<(poVar9,"`");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ret_1);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringstream::~stringstream((stringstream *)&pv);
          }
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ret.code = Unmatched;
        }
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        iVar8 = 0;
        if ((ret.code & ~AlreadyProcessed) == Success) {
          bVar6 = false;
          iVar8 = 3;
        }
        else {
          bVar6 = true;
          if (ret.code != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pv);
            poVar9 = ::std::operator<<((ostream *)&pv,"[error]");
            poVar9 = ::std::operator<<(poVar9,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                      );
            poVar9 = ::std::operator<<(poVar9,":");
            poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
            poVar9 = ::std::operator<<(poVar9,"():");
            poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf34);
            ::std::operator<<(poVar9," ");
            ::std::__cxx11::string::string
                      ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                       (allocator *)&local_268);
            args = (Property *)&ret.err;
            fmt::format<char[11],std::__cxx11::string>
                      ((string *)&ret_1,(fmt *)&attr_type_name,(string *)"familyName",
                       (char (*) [11])args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
            poVar9 = ::std::operator<<((ostream *)&pv,(string *)&ret_1);
            ::std::operator<<(poVar9,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            pTVar4 = local_320;
            if (local_320 !=
                (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&attr_type_name,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pTVar4);
              ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&ret_1);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pv);
            bVar6 = false;
            iVar8 = 1;
          }
        }
        ::std::__cxx11::string::_M_dispose();
        if (bVar6) {
          ::std::__cxx11::string::string(local_50,(string *)__lhs);
          prop = (Property *)&pv;
          ::std::__cxx11::string::string((string *)prop,"indices",(allocator *)&ret);
          args = local_328;
          (anonymous_namespace)::ParseTypedAttribute<std::vector<int,std::allocator<int>>>
                    (&ret_1,(_anonymous_namespace_ *)&table,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_50,(string *)local_328,prop,(string *)&subset->indices,
                     in_stack_fffffffffffffcc8);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          iVar8 = 0;
          if ((ret_1.code & ~AlreadyProcessed) == Success) {
            bVar6 = false;
            iVar8 = 3;
          }
          else {
            bVar6 = true;
            if (ret_1.code != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pv);
              poVar9 = ::std::operator<<((ostream *)&pv,"[error]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf35);
              ::std::operator<<(poVar9," ");
              ::std::__cxx11::string::string
                        ((string *)&attr_type_name,"Parsing attribute `{}` failed. Error: {}",
                         (allocator *)&local_268);
              args = (Property *)&ret_1.err;
              fmt::format<char[8],std::__cxx11::string>
                        ((string *)&ret,(fmt *)&attr_type_name,(string *)"indices",
                         (char (*) [8])args,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop);
              poVar9 = ::std::operator<<((ostream *)&pv,(string *)&ret);
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              pTVar4 = local_320;
              if (local_320 !=
                  (TypedAttribute<tinyusdz::Animatable<std::vector<int,_std::allocator<int>_>_>_> *)
                  0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&attr_type_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pTVar4);
                ::std::__cxx11::string::operator=((string *)pTVar4,(string *)&ret);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pv);
              bVar6 = false;
              iVar8 = 1;
            }
          }
          ::std::__cxx11::string::_M_dispose();
          if (!bVar6) goto LAB_001bfaf6;
          bVar6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"elementType");
          if (bVar6) {
            ::std::__cxx11::string::string((string *)&pv,"elementType",(allocator *)&ret_1);
            sVar10 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)&pv);
            ::std::__cxx11::string::_M_dispose();
            if (sVar10 == 0) {
              Property::value_type_name_abi_cxx11_((string *)&pv,local_328);
              tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
              _Var7 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&pv,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&ret_1);
              if ((_Var7) && (uVar1 = *(uint *)((long)&p_Var11[0x17]._M_parent + 4), uVar1 < 2)) {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                if (uVar1 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pv);
                  poVar9 = ::std::operator<<((ostream *)&pv,"[warn]");
                  poVar9 = ::std::operator<<(poVar9,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                            );
                  poVar9 = ::std::operator<<(poVar9,":");
                  poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
                  poVar9 = ::std::operator<<(poVar9,"():");
                  poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf36);
                  ::std::operator<<(poVar9," ");
                  poVar9 = ::std::operator<<((ostream *)&pv,"No value assigned to `");
                  poVar9 = ::std::operator<<(poVar9,"elementType");
                  poVar9 = ::std::operator<<(poVar9,"` token attribute. Set default token value.");
                  ::std::operator<<(poVar9,"\n");
                  if (warn != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret_1,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_320);
                    ::std::__cxx11::string::operator=((string *)warn,(string *)&ret_1);
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pv);
                  AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var11 + 7));
                  ::std::__cxx11::string::string((string *)&pv,"elementType",(allocator *)&ret_1);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&table,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pv);
                  ::std::__cxx11::string::_M_dispose();
                  goto LAB_001bfb01;
                }
              }
              else {
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              pv.has_value_ = false;
              pv._1_7_ = 0;
              pv.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
              pv.contained._16_8_ =
                   ::std::
                   _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                   ::_M_invoke;
              pv.contained._8_8_ =
                   ::std::
                   _Function_handler<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:3869:29)>
                   ::_M_manager;
              ::std::__cxx11::string::string((string *)&ret_1,"elementType",(allocator *)&ret);
              bVar6 = options->strict_allowedToken_check;
              ::std::
              function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_90,
                         (function<nonstd::expected_lite::expected<tinyusdz::GeomSubset::ElementType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)&pv);
              args = local_328;
              prop = (Property *)result;
              in_stack_fffffffffffffcc8 = local_320;
              bVar6 = ParseUniformEnumProperty<tinyusdz::GeomSubset::ElementType,tinyusdz::GeomSubset::ElementType>
                                ((string *)&ret_1,bVar6,&local_90,&local_328->_attrib,result,warn,
                                 (string *)local_320);
              if (local_90.super__Function_base._M_manager != (code *)0x0) {
                (*local_90.super__Function_base._M_manager)(&local_90,&local_90,3);
              }
              ::std::__cxx11::string::_M_dispose();
              iVar8 = 1;
              if (bVar6) {
                AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var11 + 7));
                ::std::__cxx11::string::string((string *)&ret_1,"elementType",(allocator *)&ret);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&table,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &ret_1);
                ::std::__cxx11::string::_M_dispose();
                iVar8 = 3;
              }
              if (pv.contained._8_8_ != 0) {
                (*(code *)pv.contained._8_8_)(&pv,&pv,3);
              }
              goto LAB_001bfaf6;
            }
          }
          else {
            sVar10 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)__lhs);
            if (sVar10 == 0) {
              this_00 = ::std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        ::operator[](&subset->props,(key_type *)__lhs);
              Property::operator=(this_00,local_328);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&table,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs)
              ;
            }
            sVar10 = ::std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::count(&table,(key_type *)__lhs);
            if (sVar10 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&pv);
              poVar9 = ::std::operator<<((ostream *)&pv,"[warn]");
              poVar9 = ::std::operator<<(poVar9,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                        );
              poVar9 = ::std::operator<<(poVar9,":");
              poVar9 = ::std::operator<<(poVar9,"ReconstructPrim");
              poVar9 = ::std::operator<<(poVar9,"():");
              poVar9 = (ostream *)::std::ostream::operator<<(poVar9,0xf38);
              ::std::operator<<(poVar9," ");
              ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &ret_1,"Unsupported/unimplemented property: ",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __lhs);
              poVar9 = ::std::operator<<((ostream *)&pv,(string *)&ret_1);
              ::std::operator<<(poVar9,"\n");
              ::std::__cxx11::string::_M_dispose();
              if (warn != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret_1,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_320);
                ::std::__cxx11::string::operator=((string *)warn,(string *)&ret_1);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pv);
            }
          }
        }
        else {
LAB_001bfaf6:
          if ((iVar8 != 3) && (iVar8 != 0)) break;
        }
LAB_001bfb01:
      }
      goto LAB_001bfb57;
    }
  }
  bVar5 = false;
LAB_001bfb57:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&table);
  return bVar5;
}

Assistant:

bool ReconstructPrim<GeomSubset>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomSubset *subset,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)references;

  DCOUT("GeomSubset");

  // Currently schema only allows 'face'
  auto ElementTypeHandler = [](const std::string &tok)
      -> nonstd::expected<GeomSubset::ElementType, std::string> {
    using EnumTy = std::pair<GeomSubset::ElementType, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(GeomSubset::ElementType::Face, "face"),
        std::make_pair(GeomSubset::ElementType::Point, "point"),
    };
    return EnumHandler<GeomSubset::ElementType>("elementType", tok,
                                                    enums);
  };

  std::set<std::string> table;

  if (!prim::ReconstructMaterialBindingProperties(table, properties, subset, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, subset, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "familyName", GeomSubset, subset->familyName)
    PARSE_TYPED_ATTRIBUTE(table, prop, "indices", GeomSubset, subset->indices)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "elementType", GeomSubset::ElementType, ElementTypeHandler, GeomSubset, subset->elementType, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomSubset, subset->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}